

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Rectangle::computeArea(Rectangle *this)

{
  double dVar1;
  Rectangle *this_local;
  
  dVar1 = calculateArea(&this->m_v);
  this->m_area = dVar1;
  return;
}

Assistant:

void computeArea(){
      m_area = calculateArea(m_v);
    }